

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::GenTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type,bool vectorelem,
          bool wrap_in_namespace)

{
  BaseType BVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string new_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = &bStack_88;
  GenTypeNameDest_abi_cxx11_(__return_storage_ptr__,this,type);
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_VECTOR < 2) {
LAB_001b8406:
    if (type->struct_def == (StructDef *)0x0) {
      if (type->element != BASE_TYPE_UNION) goto LAB_001b8592;
      if (!wrap_in_namespace) {
        (*(this->namer_).super_Namer._vptr_Namer[0xf])(&bStack_88,&this->namer_,type->enum_def);
        std::operator+(&local_68,&bStack_88,"Union");
        goto LAB_001b8572;
      }
      IdlNamer::NamespacedType_abi_cxx11_(&local_48,&this->namer_,&type->enum_def->super_Definition)
      ;
      std::operator+(&bStack_88,&this->package_prefix_,&local_48);
      std::operator+(&local_68,&bStack_88,"Union");
LAB_001b84eb:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&bStack_88);
      this_00 = &local_48;
    }
    else {
      psVar2 = (string *)(type->struct_def->super_Definition).name._M_string_length;
      (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_68,&this->namer_);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,
                 __return_storage_ptr__->_M_string_length - (long)psVar2,psVar2);
      this_00 = &local_68;
    }
  }
  else {
    if (BVar1 != BASE_TYPE_UNION) {
      if (BVar1 != BASE_TYPE_ARRAY) goto LAB_001b8592;
      goto LAB_001b8406;
    }
    if (wrap_in_namespace) {
      IdlNamer::NamespacedType_abi_cxx11_(&local_48,&this->namer_,&type->enum_def->super_Definition)
      ;
      std::operator+(&bStack_88,&this->package_prefix_,&local_48);
      std::operator+(&local_68,&bStack_88,"Union");
      goto LAB_001b84eb;
    }
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&bStack_88,&this->namer_,type->enum_def);
    std::operator+(&local_68,&bStack_88,"Union");
LAB_001b8572:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001b8592:
  if ((!vectorelem) &&
     ((type->base_type == BASE_TYPE_ARRAY || (type->base_type == BASE_TYPE_VECTOR)))) {
    std::operator+(&local_68,__return_storage_ptr__,"[]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet_ObjectAPI(const flatbuffers::Type &type,
                                   bool vectorelem,
                                   bool wrap_in_namespace) const {
    auto type_name = GenTypeNameDest(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name = namer_.ObjectType(*type.struct_def);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          if (wrap_in_namespace) {
            type_name =
                Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
          } else {
            type_name = namer_.Type(*type.enum_def) + "Union";
          }
        }
        break;
      }

      case BASE_TYPE_UNION: {
        if (wrap_in_namespace) {
          type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        } else {
          type_name = namer_.Type(*type.enum_def) + "Union";
        }
        break;
      }
      default: break;
    }
    if (vectorelem) { return type_name; }
    switch (type.base_type) {
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: {
        type_name = type_name + "[]";
        break;
      }
      default: break;
    }
    return type_name;
  }